

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O0

void __thiscall
Js::ConcatStringBuilder::ConcatStringBuilder
          (ConcatStringBuilder *this,ScriptContext *scriptContext,int initialSlotCount)

{
  code *pcVar1;
  bool bVar2;
  JavascriptLibrary *this_00;
  StaticType *stringType;
  undefined4 *puVar3;
  nullptr_t local_28;
  int local_1c;
  ScriptContext *pSStack_18;
  int initialSlotCount_local;
  ScriptContext *scriptContext_local;
  ConcatStringBuilder *this_local;
  
  local_1c = initialSlotCount;
  pSStack_18 = scriptContext;
  scriptContext_local = (ScriptContext *)this;
  this_00 = ScriptContext::GetLibrary(scriptContext);
  stringType = JavascriptLibrary::GetStringTypeStatic(this_00);
  ConcatStringBase::ConcatStringBase(&this->super_ConcatStringBase,stringType);
  (this->super_ConcatStringBase).super_LiteralString.super_JavascriptString.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01dfd458;
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::JavascriptString>_>::WriteBarrierPtr
            (&this->m_slots);
  this->m_count = 0;
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::ConcatStringBuilder>::WriteBarrierPtr(&this->m_prevChunk,&local_28);
  if (pSStack_18 == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                ,0x152,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  AllocateSlots(this,local_1c);
  JavascriptString::SetLength((JavascriptString *)this,0);
  return;
}

Assistant:

ConcatStringBuilder::ConcatStringBuilder(ScriptContext* scriptContext, int initialSlotCount) :
        ConcatStringBase(scriptContext->GetLibrary()->GetStringTypeStatic()),
        m_count(0), m_prevChunk(nullptr)
    {
        Assert(scriptContext);

        // Note: m_slotCount is a valid scenario -- when you don't know how many will be there.
        this->AllocateSlots(initialSlotCount);
        this->SetLength(0); // does not include null character
    }